

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::ideal_spacing(Fl_Widget_Type *this,int *x,int *y)

{
  Fl_Fontsize FVar1;
  int *y_local;
  int *x_local;
  Fl_Widget_Type *this_local;
  
  FVar1 = Fl_Widget::labelsize(this->o);
  if (FVar1 < 10) {
    *y = 0;
    *x = 0;
  }
  else {
    FVar1 = Fl_Widget::labelsize(this->o);
    if (FVar1 < 0xe) {
      *y = 5;
      *x = 5;
    }
    else {
      *y = 10;
      *x = 10;
    }
  }
  return;
}

Assistant:

void
Fl_Widget_Type::ideal_spacing(int &x, int &y) {
  if (o->labelsize() < 10)
    x = y = 0;
  else if (o->labelsize() < 14)
    x = y = 5;
  else
    x = y = 10;
}